

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall lzham::lzcompressor::send_zlib_header(lzcompressor *this)

{
  uint *puVar1;
  uint uVar2;
  void *pvVar3;
  char cVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  if (((this->m_params).m_lzham_compress_flags & 0x20) != 0) {
    uVar5 = (ulong)(this->m_params).m_compression_level;
    iVar7 = (this->m_params).m_dict_size_log2 * 0x10 + -0xe2;
    uVar9 = 0xc0;
    if (uVar5 < 4) {
      uVar9 = *(uint *)(&DAT_00111080 + uVar5 * 4);
    }
    uVar8 = uVar9 | 0x20;
    if ((this->m_params).m_pSeed_bytes == (void *)0x0) {
      uVar8 = uVar9;
    }
    iVar6 = (int)(iVar7 * 0x100 | uVar8) % 0x1f;
    uVar9 = (uVar8 | 0x1f) - iVar6;
    if (iVar6 == 0) {
      uVar9 = uVar8;
    }
    uVar10 = (int)this + 0x3950;
    uVar8 = (this->m_comp_buf).m_size;
    if ((this->m_comp_buf).m_capacity <= uVar8) {
      cVar4 = lzham::elemental_vector::increase_capacity
                        (uVar10,(bool)((char)uVar8 + '\x01'),1,
                         (_func_void_void_ptr_void_ptr_uint *)0x1,false);
      if (cVar4 == '\0') {
        return false;
      }
      uVar8 = (this->m_comp_buf).m_size;
    }
    (this->m_comp_buf).m_p[uVar8] = (uchar)iVar7;
    uVar2 = (this->m_comp_buf).m_size;
    uVar8 = uVar2 + 1;
    (this->m_comp_buf).m_size = uVar8;
    if ((this->m_comp_buf).m_capacity <= uVar8) {
      cVar4 = lzham::elemental_vector::increase_capacity
                        (uVar10,(bool)((char)uVar2 + '\x02'),1,
                         (_func_void_void_ptr_void_ptr_uint *)0x1,false);
      if (cVar4 == '\0') {
        return false;
      }
      uVar8 = (this->m_comp_buf).m_size;
    }
    (this->m_comp_buf).m_p[uVar8] = (uchar)uVar9;
    puVar1 = &(this->m_comp_buf).m_size;
    *puVar1 = *puVar1 + 1;
    pvVar3 = (this->m_params).m_pSeed_bytes;
    if (pvVar3 != (void *)0x0) {
      iVar7 = lzham::adler32(pvVar3,(ulong)(this->m_params).m_num_seed_bytes,1);
      uVar9 = (this->m_comp_buf).m_size;
      iVar6 = 4;
      do {
        if ((this->m_comp_buf).m_capacity <= uVar9) {
          cVar4 = lzham::elemental_vector::increase_capacity
                            (uVar10,(bool)((char)uVar9 + '\x01'),1,
                             (_func_void_void_ptr_void_ptr_uint *)0x1,false);
          if (cVar4 == '\0') {
            return false;
          }
          uVar9 = (this->m_comp_buf).m_size;
        }
        (this->m_comp_buf).m_p[uVar9] = (uchar)((uint)iVar7 >> 0x18);
        uVar9 = (this->m_comp_buf).m_size + 1;
        (this->m_comp_buf).m_size = uVar9;
        iVar7 = iVar7 << 8;
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  return true;
}

Assistant:

bool lzcompressor::send_zlib_header()
   {
      if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_WRITE_ZLIB_STREAM) == 0)
         return true;

      // set CM (method) and CINFO (dictionary size) fields
      int cmf = LZHAM_Z_LZHAM | ((m_params.m_dict_size_log2 - 15) << 4);

      // set FLEVEL by mapping LZHAM's compression level to zlib's
      int flg = 0;
      switch (m_params.m_compression_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:
         {
            flg = 0 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_FASTER:
         {
            flg = 1 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_DEFAULT:
         case LZHAM_COMP_LEVEL_BETTER:
         {
            flg = 2 << 6;
            break;
         }
         default:
         {
            flg = 3 << 6;
            break;
         }
      }

      // set FDICT flag
      if (m_params.m_pSeed_bytes)
         flg |= 32;

      int check = ((cmf << 8) + flg) % 31;
      if (check)
         flg += (31 - check);

      LZHAM_ASSERT(0 == (((cmf << 8) + flg) % 31));
      if (!m_comp_buf.try_push_back(static_cast<uint8>(cmf)))
         return false;
      if (!m_comp_buf.try_push_back(static_cast<uint8>(flg)))
         return false;

      if (m_params.m_pSeed_bytes)
      {
         // send adler32 of DICT
         uint dict_adler32 = adler32(m_params.m_pSeed_bytes, m_params.m_num_seed_bytes);
         for (uint i = 0; i < 4; i++)
         {
            if (!m_comp_buf.try_push_back(static_cast<uint8>(dict_adler32 >> 24)))
               return false;
            dict_adler32 <<= 8;
         }
      }

      return true;
   }